

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  LensElementInterface *pLVar1;
  undefined1 auVar2 [16];
  Normal3f n;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [56];
  float fVar14;
  undefined1 auVar15 [16];
  Point3f PVar16;
  Vector3<float> wi;
  Float t;
  float local_cc;
  Vector3f local_c8;
  Tuple3<pbrt::Normal3,_float> local_b8;
  undefined1 local_a8 [16];
  Ray local_98;
  Ray *local_70;
  Image *local_68;
  Tuple3<pbrt::Vector3,_float> local_60;
  WrapMode2D local_50;
  undefined1 local_48 [16];
  float fVar7;
  
  local_98.o.super_Tuple3<pbrt::Point3,_float>.x = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_98.o.super_Tuple3<pbrt::Point3,_float>.y = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._0_12_ = *(undefined1 (*) [12])&rCamera->d;
  auVar10._12_4_ = rCamera->time;
  local_98.d.super_Tuple3<pbrt::Vector3,_float>.z =
       -(rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_98.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar10._0_8_;
  local_98.time = (Float)vextractps_avx(auVar10,3);
  local_98.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_68 = &this->apertureImage;
  local_a8._0_4_ = 0x3f800000;
  local_cc = 0.0;
  uVar3 = (uint)(this->elementInterfaces).nStored;
  local_98.o.super_Tuple3<pbrt::Point3,_float>.z = -(rCamera->o).super_Tuple3<pbrt::Point3,_float>.z
  ;
  local_70 = rOut;
  while( true ) {
    do {
      while( true ) {
        uVar5 = uVar3;
        uVar3 = uVar5 - 1;
        if ((int)uVar3 < 0) {
          if (local_70 != (Ray *)0x0) {
            auVar2._8_4_ = local_98.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar2._0_4_ = local_98.d.super_Tuple3<pbrt::Vector3,_float>.x;
            auVar2._4_4_ = local_98.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar2._12_4_ = local_98.time;
            (local_70->o).super_Tuple3<pbrt::Point3,_float>.x =
                 local_98.o.super_Tuple3<pbrt::Point3,_float>.x;
            (local_70->o).super_Tuple3<pbrt::Point3,_float>.y =
                 local_98.o.super_Tuple3<pbrt::Point3,_float>.y;
            (local_70->o).super_Tuple3<pbrt::Point3,_float>.z =
                 -local_98.o.super_Tuple3<pbrt::Point3,_float>.z;
            (local_70->d).super_Tuple3<pbrt::Vector3,_float>.x =
                 local_98.d.super_Tuple3<pbrt::Vector3,_float>.x;
            (local_70->d).super_Tuple3<pbrt::Vector3,_float>.y =
                 local_98.d.super_Tuple3<pbrt::Vector3,_float>.y;
            (local_70->d).super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_98.d.super_Tuple3<pbrt::Vector3,_float>.z;
            FVar8 = (Float)vextractps_avx(auVar2,3);
            local_70->time = FVar8;
            (local_70->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = 0;
          }
          return (Float)local_a8._0_4_;
        }
        pLVar1 = (this->elementInterfaces).ptr;
        uVar6 = uVar3 & 0x7fffffff;
        local_cc = local_cc - pLVar1[uVar6].thickness;
        local_b8.x = 0.0;
        local_b8.y = 0.0;
        local_b8.z = 0.0;
        fVar9 = pLVar1[uVar6].curvatureRadius;
        if ((fVar9 != 0.0) || (NAN(fVar9))) {
          bVar4 = IntersectSphericalElement
                            (fVar9,local_cc + fVar9,&local_98,&t,(Normal3f *)&local_b8);
          if (!bVar4) {
            return 0.0;
          }
          auVar12 = ZEXT464((uint)t);
        }
        else {
          t = (local_cc - local_98.o.super_Tuple3<pbrt::Point3,_float>.z) /
              local_98.d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar12 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),t));
          if (t < 0.0) {
            return 0.0;
          }
        }
        auVar13 = auVar12._8_56_;
        PVar16 = Ray::operator()(&local_98,auVar12._0_4_);
        fVar14 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
        auVar12._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar12._8_56_ = auVar13;
        fVar7 = PVar16.super_Tuple3<pbrt::Point3,_float>.x;
        auVar10 = auVar12._0_16_;
        if ((((fVar9 != 0.0) || (NAN(fVar9))) ||
            ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1)) ||
           ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) break;
        auVar2 = vmovshdup_avx(auVar10);
        local_a8 = vinsertps_avx(ZEXT416((uint)((fVar7 / pLVar1[uVar6].apertureRadius + 1.0) * 0.5))
                                 ,ZEXT416((uint)(1.0 - (auVar2._0_4_ / pLVar1[uVar6].apertureRadius
                                                       + 1.0) * 0.5)),0x10);
        local_48 = auVar10;
        WrapMode2D::WrapMode2D(&local_50,Black);
        FVar8 = Image::BilerpChannel(local_68,(Point2f)local_a8._0_8_,0,local_50);
        local_a8._0_4_ = FVar8;
        if ((FVar8 == 0.0) && (!NAN(FVar8))) {
          return 0.0;
        }
        local_98.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(local_48);
        local_98.o.super_Tuple3<pbrt::Point3,_float>.z = fVar14;
      }
      auVar15._0_4_ = fVar7 * fVar7;
      auVar15._4_4_ =
           PVar16.super_Tuple3<pbrt::Point3,_float>.y * PVar16.super_Tuple3<pbrt::Point3,_float>.y;
      auVar15._8_4_ = auVar13._0_4_ * auVar13._0_4_;
      auVar15._12_4_ = auVar13._4_4_ * auVar13._4_4_;
      auVar2 = vhaddps_avx(auVar15,auVar15);
      if (pLVar1[uVar6].apertureRadius * pLVar1[uVar6].apertureRadius < auVar2._0_4_) {
        return 0.0;
      }
      local_98.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar10);
    } while ((fVar9 == 0.0) &&
            (local_98.o.super_Tuple3<pbrt::Point3,_float>.z = fVar14, !NAN(fVar9)));
    local_c8.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    local_c8.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    local_c8.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    fVar9 = 1.0;
    if (uVar5 != 1) {
      fVar7 = (this->elementInterfaces).ptr[uVar5 - 2].eta;
      if ((fVar7 != 0.0) || (fVar9 = 1.0, NAN(fVar7))) {
        fVar9 = fVar7;
      }
    }
    fVar7 = pLVar1[uVar6].eta;
    local_60.z = -local_98.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = local_98.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar11._8_4_ = 0x80000000;
    auVar11._12_4_ = 0x80000000;
    local_60._0_8_ = vmovlps_avx(auVar11);
    local_98.o.super_Tuple3<pbrt::Point3,_float>.z = fVar14;
    wi = Normalize<float>((Vector3<float> *)&local_60);
    n.super_Tuple3<pbrt::Normal3,_float>.z = local_b8.z;
    n.super_Tuple3<pbrt::Normal3,_float>.x = local_b8.x;
    n.super_Tuple3<pbrt::Normal3,_float>.y = local_b8.y;
    bVar4 = Refract((Vector3f)wi.super_Tuple3<pbrt::Vector3,_float>,n,fVar9 / fVar7,&local_c8);
    if (!bVar4) break;
    local_98.d.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.super_Tuple3<pbrt::Vector3,_float>.z;
    local_98.d.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.super_Tuple3<pbrt::Vector3,_float>.x;
    local_98.d.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.super_Tuple3<pbrt::Vector3,_float>.y;
  }
  return 0.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            uv.y = 1 - uv.y;
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            Float r2 = Sqr(pHit.x) + Sqr(pHit.y);
            if (r2 > Sqr(element.apertureRadius))
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}